

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.h
# Opt level: O2

BFunc<6UL> * __thiscall GF2::BFunc<6UL>::Rand(BFunc<6UL> *this)

{
  ulong uVar1;
  WW<64UL> w;
  WW<64UL> local_18;
  
  local_18._words[0] = (word  [1])0;
  WW<64UL>::Rand(&local_18);
  for (uVar1 = 0; uVar1 != 0x40; uVar1 = uVar1 + 1) {
    (this->super_Func<6UL,_bool>)._vals[uVar1] =
         ((ulong)local_18._words[0] >> (uVar1 & 0x3f) & 1) != 0;
  }
  return this;
}

Assistant:

BFunc& Rand()
	{
		WW<_size> w;
		w.Rand();
		for (word x = 0; x < _size; x++)
			Set(x, w[x]);
		return *this;
	}